

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUGD20M303DLHC.cpp
# Opt level: O2

bool __thiscall RTIMUGD20M303DLHC::setGyroSampleRate(RTIMUGD20M303DLHC *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  RTIMUSettings *this_00;
  bool bVar4;
  byte bVar5;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_GD20M303DLHCGyroSampleRate;
  if ((ulong)uVar1 < 4) {
    uVar2 = *(uint *)(&DAT_0011fb70 + (ulong)uVar1 * 4);
    bVar5 = (char)uVar1 << 6;
    (this->super_RTIMU).m_sampleRate = uVar2;
    (this->super_RTIMU).m_sampleInterval = 1000000 / (ulong)uVar2;
    iVar3 = this_00->m_GD20M303DLHCGyroBW;
    if (iVar3 == 3) {
      bVar5 = bVar5 | 0x3f;
    }
    else if (iVar3 == 2) {
      bVar5 = bVar5 | 0x2f;
    }
    else if (iVar3 == 1) {
      bVar5 = bVar5 | 0x1f;
    }
    else {
      bVar5 = bVar5 | 0xf;
    }
    bVar4 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_gyroSlaveAddr,' ',bVar5,
                               "Failed to set L3GD20 CTRL1");
    return bVar4;
  }
  fprintf(_stderr,"Illegal L3GD20 sample rate code %d\n",(ulong)uVar1);
  return false;
}

Assistant:

bool RTIMUGD20M303DLHC::setGyroSampleRate()
{
    unsigned char ctrl1;

    switch (m_settings->m_GD20M303DLHCGyroSampleRate) {
    case L3GD20_SAMPLERATE_95:
        ctrl1 = 0x0f;
        m_sampleRate = 95;
        break;

    case L3GD20_SAMPLERATE_190:
        ctrl1 = 0x4f;
        m_sampleRate = 190;
        break;

    case L3GD20_SAMPLERATE_380:
        ctrl1 = 0x8f;
        m_sampleRate = 380;
        break;

    case L3GD20_SAMPLERATE_760:
        ctrl1 = 0xcf;
        m_sampleRate = 760;
        break;

    default:
        HAL_ERROR1("Illegal L3GD20 sample rate code %d\n", m_settings->m_GD20M303DLHCGyroSampleRate);
        return false;
    }

    m_sampleInterval = (uint64_t)1000000 / m_sampleRate;

    switch (m_settings->m_GD20M303DLHCGyroBW) {
    case L3GD20_BANDWIDTH_0:
        ctrl1 |= 0x00;
        break;

    case L3GD20_BANDWIDTH_1:
        ctrl1 |= 0x10;
        break;

    case L3GD20_BANDWIDTH_2:
        ctrl1 |= 0x20;
        break;

    case L3GD20_BANDWIDTH_3:
        ctrl1 |= 0x30;
        break;

    }

    return (m_settings->HALWrite(m_gyroSlaveAddr, L3GD20_CTRL1, ctrl1, "Failed to set L3GD20 CTRL1"));
}